

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

void av1_mc_flow_dispenser_row
               (AV1_COMP *cpi,TplTxfmStats *tpl_txfm_stats,TplBuffers *tpl_tmp_buffers,MACROBLOCK *x
               ,int mi_row,BLOCK_SIZE bsize,TX_SIZE tx_size)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  long lVar5;
  uint mi_width_00;
  int iVar6;
  long in_RCX;
  long *in_RDI;
  int in_R8D;
  byte in_R9B;
  TplDepStats tpl_stats;
  _Bool tpl_mt_exit;
  int tplb_col_in_tile;
  int mi_col;
  int tplb_row;
  int tplb_cols_in_tile;
  MACROBLOCKD *xd;
  TplDepFrame *tpl_frame;
  TplParams *tpl_data;
  int mi_width;
  CommonModeInfoParams *mi_params;
  AV1TplRowMultiThreadInfo *tpl_row_mt;
  MultiThreadInfo *mt_info;
  AV1_COMMON *cm;
  int in_stack_000004b0;
  int in_stack_000004b4;
  MACROBLOCK *in_stack_000004b8;
  TplBuffers *in_stack_000004c0;
  TplTxfmStats *in_stack_000004c8;
  AV1_COMP *in_stack_000004d0;
  BLOCK_SIZE in_stack_00000510;
  TX_SIZE in_stack_00000518;
  TplDepStats *in_stack_00000520;
  uint8_t in_stack_fffffffffffffee7;
  TplDepStats *in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef4;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  TplDepStats *in_stack_ffffffffffffff00;
  int local_78;
  int local_74;
  
  mi_width_00 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                      [in_R9B];
  lVar4 = *in_RDI;
  lVar5 = in_RDI[0x7833];
  bVar1 = ""[in_R9B];
  bVar2 = ""[in_R9B];
  iVar6 = in_R8D + ((1 << (""[in_R9B] & 0x1f)) >> 1) >> (""[in_R9B] & 0x1f);
  local_74 = 0;
  local_78 = 0;
  do {
    if ((int)in_RDI[0x7833] <= local_74) {
      return;
    }
    (*(code *)in_RDI[0x13601])(lVar4 + 0x12328,iVar6,local_78);
    if (1 < (int)in_RDI[0x135c9]) {
      pthread_mutex_lock((pthread_mutex_t *)in_RDI[0x13600]);
      bVar3 = *(byte *)(in_RDI + 0x135ff);
      pthread_mutex_unlock((pthread_mutex_t *)in_RDI[0x13600]);
      if ((bVar3 & 1) != 0) {
        return;
      }
    }
    av1_set_mv_col_limits
              ((CommonModeInfoParams *)(in_RDI + 0x7831),(FullMvLimits *)(in_RCX + 0x1f6e4),local_74
               ,mi_width_00,*(int *)(lVar4 + 0x12350));
    *(int *)(in_RCX + 0x2094) = local_74 * -0x20;
    *(uint *)(in_RCX + 0x2098) = (((int)in_RDI[0x7833] - mi_width_00) - local_74) * 8;
    mode_estimation(in_stack_000004d0,in_stack_000004c8,in_stack_000004c0,in_stack_000004b8,
                    in_stack_000004b4,in_stack_000004b0,in_stack_00000510,in_stack_00000518,
                    in_stack_00000520);
    tpl_model_store(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
                    in_stack_fffffffffffffef4,in_stack_fffffffffffffee8,in_stack_fffffffffffffee7);
    (*(code *)in_RDI[0x13602])
              (lVar4 + 0x12328,iVar6,local_78,
               (int)lVar5 + ((1 << (bVar1 & 0x1f)) >> 1) >> (bVar2 & 0x1f));
    local_74 = mi_width_00 + local_74;
    local_78 = local_78 + 1;
  } while( true );
}

Assistant:

void av1_mc_flow_dispenser_row(AV1_COMP *cpi, TplTxfmStats *tpl_txfm_stats,
                               TplBuffers *tpl_tmp_buffers, MACROBLOCK *x,
                               int mi_row, BLOCK_SIZE bsize, TX_SIZE tx_size) {
  AV1_COMMON *const cm = &cpi->common;
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  AV1TplRowMultiThreadInfo *const tpl_row_mt = &mt_info->tpl_row_mt;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const int mi_width = mi_size_wide[bsize];
  TplParams *const tpl_data = &cpi->ppi->tpl_data;
  TplDepFrame *tpl_frame = &tpl_data->tpl_frame[tpl_data->frame_idx];
  MACROBLOCKD *xd = &x->e_mbd;

  const int tplb_cols_in_tile =
      ROUND_POWER_OF_TWO(mi_params->mi_cols, mi_size_wide_log2[bsize]);
  const int tplb_row = ROUND_POWER_OF_TWO(mi_row, mi_size_high_log2[bsize]);
  assert(mi_size_high[bsize] == (1 << tpl_data->tpl_stats_block_mis_log2));
  assert(mi_size_wide[bsize] == (1 << tpl_data->tpl_stats_block_mis_log2));

  for (int mi_col = 0, tplb_col_in_tile = 0; mi_col < mi_params->mi_cols;
       mi_col += mi_width, tplb_col_in_tile++) {
    (*tpl_row_mt->sync_read_ptr)(&tpl_data->tpl_mt_sync, tplb_row,
                                 tplb_col_in_tile);

#if CONFIG_MULTITHREAD
    if (mt_info->num_workers > 1) {
      pthread_mutex_lock(tpl_row_mt->mutex_);
      const bool tpl_mt_exit = tpl_row_mt->tpl_mt_exit;
      pthread_mutex_unlock(tpl_row_mt->mutex_);
      // Exit in case any worker has encountered an error.
      if (tpl_mt_exit) return;
    }
#endif

    TplDepStats tpl_stats;

    // Motion estimation column boundary
    av1_set_mv_col_limits(mi_params, &x->mv_limits, mi_col, mi_width,
                          tpl_data->border_in_pixels);
    xd->mb_to_left_edge = -GET_MV_SUBPEL(mi_col * MI_SIZE);
    xd->mb_to_right_edge =
        GET_MV_SUBPEL(mi_params->mi_cols - mi_width - mi_col);
    mode_estimation(cpi, tpl_txfm_stats, tpl_tmp_buffers, x, mi_row, mi_col,
                    bsize, tx_size, &tpl_stats);

    // Motion flow dependency dispenser.
    tpl_model_store(tpl_frame->tpl_stats_ptr, mi_row, mi_col, tpl_frame->stride,
                    &tpl_stats, tpl_data->tpl_stats_block_mis_log2);
    (*tpl_row_mt->sync_write_ptr)(&tpl_data->tpl_mt_sync, tplb_row,
                                  tplb_col_in_tile, tplb_cols_in_tile);
  }
}